

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O0

uv_dirent_type_t uv__fs_get_dirent_type(uv__dirent_t *dent)

{
  uv_dirent_type_t local_14;
  uv_dirent_type_t type;
  uv__dirent_t *dent_local;
  
  switch(dent->d_type) {
  case '\x01':
    local_14 = UV_DIRENT_FIFO;
    break;
  case '\x02':
    local_14 = UV_DIRENT_CHAR;
    break;
  default:
    local_14 = UV_DIRENT_UNKNOWN;
    break;
  case '\x04':
    local_14 = UV_DIRENT_DIR;
    break;
  case '\x06':
    local_14 = UV_DIRENT_BLOCK;
    break;
  case '\b':
    local_14 = UV_DIRENT_FILE;
    break;
  case '\n':
    local_14 = UV_DIRENT_LINK;
    break;
  case '\f':
    local_14 = UV_DIRENT_SOCKET;
  }
  return local_14;
}

Assistant:

uv_dirent_type_t uv__fs_get_dirent_type(uv__dirent_t* dent) {
  uv_dirent_type_t type;

#ifdef HAVE_DIRENT_TYPES
  switch (dent->d_type) {
    case UV__DT_DIR:
      type = UV_DIRENT_DIR;
      break;
    case UV__DT_FILE:
      type = UV_DIRENT_FILE;
      break;
    case UV__DT_LINK:
      type = UV_DIRENT_LINK;
      break;
    case UV__DT_FIFO:
      type = UV_DIRENT_FIFO;
      break;
    case UV__DT_SOCKET:
      type = UV_DIRENT_SOCKET;
      break;
    case UV__DT_CHAR:
      type = UV_DIRENT_CHAR;
      break;
    case UV__DT_BLOCK:
      type = UV_DIRENT_BLOCK;
      break;
    default:
      type = UV_DIRENT_UNKNOWN;
  }
#else
  type = UV_DIRENT_UNKNOWN;
#endif

  return type;
}